

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

HeapSimpleObject * __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::
makeHeap<jsonnet::internal::(anonymous_namespace)::HeapSimpleObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>&,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>>>&,std::__cxx11::list<jsonnet::internal::AST*,std::allocator<jsonnet::internal::AST*>>&>
          (Interpreter *this,
          map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          *args,map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
                *args_1,
          list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *args_2)

{
  Value v;
  bool bVar1;
  iterator this_00;
  reference ppVar2;
  Heap *in_RDI;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
  *unaff_retaddr;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>
  *sourceVal;
  iterator __end4_1;
  iterator __begin4_1;
  SourceFuncMap *__range4_1;
  HeapThunk *thunk;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>
  *pair;
  iterator __end4;
  iterator __begin4;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
  *__range4;
  HeapSimpleObject *r;
  HeapEntity *in_stack_00000188;
  Heap *in_stack_00000190;
  Heap *in_stack_ffffffffffffff80;
  _Self in_stack_ffffffffffffff88;
  anon_union_8_3_4e909c26_for_v in_stack_ffffffffffffff90;
  Heap *in_stack_ffffffffffffff98;
  Stack *in_stack_ffffffffffffffa0;
  _Self local_48;
  double *local_40;
  undefined8 local_38;
  double local_30;
  HeapSimpleObject *local_28;
  
  local_28 = Heap::
             makeEntity<jsonnet::internal::(anonymous_namespace)::HeapSimpleObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>&,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>>>&,std::__cxx11::list<jsonnet::internal::AST*,std::allocator<jsonnet::internal::AST*>>&>
                       ((Heap *)__end4_1._M_node,
                        (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                         *)sourceVal,unaff_retaddr,
                        (list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *
                        )in_RDI);
  bVar1 = anon_unknown_0::Heap::checkHeap(in_RDI);
  if (bVar1) {
    anon_unknown_0::Heap::markFrom(in_stack_00000190,in_stack_00000188);
    anon_unknown_0::Stack::mark(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_38 = *(undefined8 *)(in_RDI + 1);
    local_30 = in_RDI[1].gcTuneGrowthTrigger;
    v.v.h = in_stack_ffffffffffffff90.h;
    v._0_8_ = in_stack_ffffffffffffff88._M_node;
    anon_unknown_0::Heap::markFrom(in_stack_ffffffffffffff80,v);
    local_40 = &in_RDI[3].gcTuneGrowthTrigger;
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
         ::begin((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
                  *)in_RDI);
    this_00 = std::
              map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
              ::end((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
                     *)in_RDI);
    while (bVar1 = std::operator!=(&local_48,(_Self *)&stack0xffffffffffffffb0), bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>
                            *)in_stack_ffffffffffffff80);
      if (ppVar2->second->thunk != (HeapThunk *)0x0) {
        anon_unknown_0::Heap::markFrom(in_stack_00000190,in_stack_00000188);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>
                    *)in_stack_ffffffffffffff80);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             *)in_RDI);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)in_RDI);
    while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff90,
                                   (_Self *)&stack0xffffffffffffff88), bVar1) {
      in_stack_ffffffffffffff80 =
           (Heap *)std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                                *)in_stack_ffffffffffffff80);
      anon_unknown_0::Heap::markFrom(in_stack_00000190,in_stack_00000188);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                    *)in_stack_ffffffffffffff80);
    }
    anon_unknown_0::Heap::sweep((Heap *)this_00._M_node);
  }
  return local_28;
}

Assistant:

T *makeHeap(Args &&... args)
    {
        T *r = heap.makeEntity<T, Args...>(std::forward<Args>(args)...);
        if (heap.checkHeap()) {  // Do a GC cycle?
            // Avoid the object we just made being collected.
            heap.markFrom(r);

            // Mark from the stack.
            stack.mark(heap);

            // Mark from the scratch register
            heap.markFrom(scratch);

            // Mark from cached imports
            for (const auto &pair : cachedImports) {
                HeapThunk *thunk = pair.second->thunk;
                if (thunk != nullptr)
                    heap.markFrom(thunk);
            }

            for (const auto &sourceVal : sourceVals) {
                heap.markFrom(sourceVal.second);
            }

            // Delete unreachable objects.
            heap.sweep();
        }
        return r;
    }